

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-summon.c
# Opt level: O1

errr finish_parse_summon(parser *p)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  summon *psVar9;
  wchar_t wVar10;
  undefined8 *puVar11;
  long *p_00;
  long lVar12;
  ulong uVar13;
  bool bVar14;
  
  summon_max = L'\0';
  for (puVar11 = (undefined8 *)parser_priv(p); puVar11 != (undefined8 *)0x0;
      puVar11 = (undefined8 *)*puVar11) {
    summon_max = summon_max + L'\x01';
  }
  summons = (summon *)mem_zalloc((long)summon_max * 0x40 + 0x40);
  lVar12 = (long)summon_max;
  p_00 = (long *)parser_priv(p);
  if (p_00 != (long *)0x0) {
    lVar12 = lVar12 << 6;
    do {
      psVar9 = summons;
      lVar2 = *p_00;
      lVar3 = p_00[1];
      lVar4 = p_00[2];
      lVar5 = p_00[3];
      lVar6 = p_00[4];
      lVar7 = p_00[5];
      lVar8 = p_00[7];
      plVar1 = (long *)((long)&summons[-1].fallback + lVar12);
      *plVar1 = p_00[6];
      plVar1[1] = lVar8;
      plVar1 = (long *)((long)&psVar9[-1].race_flag + lVar12);
      *plVar1 = lVar6;
      plVar1[1] = lVar7;
      plVar1 = (long *)((long)&psVar9[-1].message_type + lVar12);
      *plVar1 = lVar4;
      plVar1[1] = lVar5;
      plVar1 = (long *)((long)&psVar9[-1].next + lVar12);
      *plVar1 = lVar2;
      plVar1[1] = lVar3;
      plVar1 = (long *)*p_00;
      *(undefined8 *)((long)&psVar9[-1].next + lVar12) = 0;
      mem_free(p_00);
      p_00 = plVar1;
      lVar12 = lVar12 + -0x40;
    } while (plVar1 != (long *)0x0);
  }
  psVar9 = summons;
  uVar13 = (ulong)(uint)summon_max;
  wVar10 = summon_max + L'\x01';
  bVar14 = L'\xffffffff' < summon_max;
  summon_max = wVar10;
  if (bVar14) {
    lVar12 = 0;
    do {
      wVar10 = summon_name_to_idx(*(char **)((long)&psVar9->fallback_name + lVar12));
      *(wchar_t *)((long)&psVar9->fallback + lVar12) = wVar10;
      lVar12 = lVar12 + 0x40;
    } while (uVar13 * 0x40 + 0x40 != lVar12);
  }
  parser_destroy(p);
  return 0;
}

Assistant:

static errr finish_parse_summon(struct parser *p) {
	struct summon *summon, *next;
	int index;

	/* Count the entries */
	summon_max = 0;
	summon = parser_priv(p);
	while (summon) {
		summon_max++;
		summon = summon->next;
	}

	/* Allocate the direct access list and copy the data to it */
	summons = mem_zalloc((summon_max + 1) * sizeof(*summon));
	index = summon_max - 1;
	for (summon = parser_priv(p); summon; summon = next, index--) {
		memcpy(&summons[index], summon, sizeof(*summon));
		next = summon->next;
		summons[index].next = NULL;

		mem_free(summon);
	}
	summon_max += 1;

	/* Add indices of fallback summons */
	for (index = 0; index < summon_max; index++) {
		char *name = summons[index].fallback_name;
		summons[index].fallback = summon_name_to_idx(name);
	}

	parser_destroy(p);
	return 0;
}